

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void __thiscall counting_list<unsigned_char_*>::clear(counting_list<unsigned_char_*> *this)

{
  counting_list<unsigned_char_*> *pcVar1;
  counting_list<unsigned_char_*> *pcVar2;
  
  this->_size = 0;
  pcVar2 = (counting_list<unsigned_char_*> *)
           (this->super_list<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
           super__List_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (pcVar2 != this) {
    pcVar1 = (counting_list<unsigned_char_*> *)
             (pcVar2->super_list<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
             super__List_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl._M_node.
             super__List_node_base._M_next;
    operator_delete(pcVar2);
    pcVar2 = pcVar1;
  }
  (this->super_list<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
  super__List_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->super_list<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
  super__List_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (this->super_list<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
  super__List_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

void clear()
	{
		_size = 0;
		std::list<T>::clear();
	}